

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArticulatedPart.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::ArticulatedPart::ArticulatedPart(ArticulatedPart *this)

{
  VariableParameter::VariableParameter(&this->super_VariableParameter);
  (this->super_VariableParameter).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__ArticulatedPart_002235d8;
  this->m_ui8ParmeterChange = '\0';
  (this->super_VariableParameter).m_ui8VarParamType = '\0';
  *(undefined8 *)&this->m_ui16AttachementID = 0;
  this->m_f32ParamValue = 0.0;
  this->m_ui32Padding = 0;
  return;
}

Assistant:

ArticulatedPart::ArticulatedPart() :
    m_ui8ParmeterChange( 0 ),
    m_ui16AttachementID( 0 ),
    m_ui32ParamTypeVariant( 0 ),
    m_f32ParamValue( 0 ),
    m_ui32Padding( 0 )
{    
    m_ui8VarParamType = ArticulatedPartType;
}